

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O3

void vp8hwdDecodeCoeffUpdate(VP8DParserContext_t *p)

{
  RK_U32 RVar1;
  long lVar2;
  long lVar3;
  RK_U8 (*paaaRVar4) [8] [3] [11];
  RK_U8 (*paaaRVar5) [8] [3] [11];
  RK_U8 (*paaaRVar6) [8] [3] [11];
  long lVar7;
  long lVar8;
  RK_U8 (*paaaRVar9) [8] [3] [11];
  RK_U8 (*paRVar10) [11];
  RK_U8 (*paRVar11) [11];
  
  if (((byte)vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",800,
               "vp8hwdDecodeCoeffUpdate");
  }
  paaaRVar4 = (p->entropy).probCoeffs;
  paaaRVar9 = CoeffUpdateProbs;
  lVar2 = 0;
  do {
    lVar3 = 0;
    paaaRVar5 = paaaRVar4;
    paRVar10 = (RK_U8 (*) [11])paaaRVar9;
    do {
      lVar7 = 0;
      paaaRVar6 = paaaRVar5;
      paRVar11 = paRVar10;
      do {
        lVar8 = 0;
        do {
          RVar1 = vp8hwdDecodeBool(&p->bitstr,(uint)(*(RK_U8 (*) [3] [11])*paRVar11)[0][lVar8]);
          if (RVar1 != 0) {
            RVar1 = vp8hwdReadBits(&p->bitstr,8);
            (*paaaRVar6)[0][0][lVar8] = (RK_U8)RVar1;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xb);
        lVar7 = lVar7 + 1;
        paRVar11 = paRVar11 + 1;
        paaaRVar6 = (RK_U8 (*) [8] [3] [11])((*paaaRVar6)[0] + 1);
      } while (lVar7 != 3);
      lVar3 = lVar3 + 1;
      paRVar10 = paRVar10 + 3;
      paaaRVar5 = (RK_U8 (*) [8] [3] [11])(*paaaRVar5 + 1);
    } while (lVar3 != 8);
    lVar2 = lVar2 + 1;
    paaaRVar9 = (RK_U8 (*) [8] [3] [11])((long)paaaRVar9 + 0x108);
    paaaRVar4 = paaaRVar4 + 1;
  } while (lVar2 != 4);
  if (((byte)vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x32d,
               "vp8hwdDecodeCoeffUpdate");
  }
  return;
}

Assistant:

static void vp8hwdDecodeCoeffUpdate(VP8DParserContext_t *p)
{
    RK_U32 i, j, k, l;

    FUN_T("FUN_IN");
    for ( i = 0; i < 4; i++ ) {
        for ( j = 0; j < 8; j++ ) {
            for ( k = 0; k < 3; k++ ) {
                for ( l = 0; l < 11; l++ ) {
                    if (vp8hwdDecodeBool(&p->bitstr,
                                         CoeffUpdateProbs[i][j][k][l]))
                        p->entropy.probCoeffs[i][j][k][l] =
                            vp8hwdReadBits(&p->bitstr, 8);
                }
            }
        }
    }
    FUN_T("FUN_OUT");
}